

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loc.cc
# Opt level: O2

bool __thiscall tchecker::system::locs_t::is_initial_location(locs_t *this,loc_id_t id)

{
  uint uVar1;
  pointer psVar2;
  pointer pvVar3;
  pointer psVar4;
  invalid_argument *this_00;
  loc_shared_ptr_t *loc;
  pointer psVar5;
  
  psVar2 = (this->_locs).
           super__Vector_base<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(this->_locs).
                    super__Vector_base<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)psVar2 >> 4) <= (ulong)id) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Unknown location identifier");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  uVar1 = (psVar2[id].super___shared_ptr<tchecker::system::loc_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          )->_pid;
  pvVar3 = (this->_initial_locs).
           super__Vector_base<std::vector<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>,_std::allocator<std::vector<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar2 = *(pointer *)
            ((long)&pvVar3[uVar1].
                    super__Vector_base<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>
                    ._M_impl.super__Vector_impl_data + 8);
  psVar4 = pvVar3[uVar1].
           super__Vector_base<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    psVar5 = psVar4;
    if (psVar5 == psVar2) break;
    psVar4 = psVar5 + 1;
  } while (((psVar5->super___shared_ptr<tchecker::system::loc_t,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
           )->_id != id);
  return psVar5 != psVar2;
}

Assistant:

bool locs_t::is_location(tchecker::loc_id_t id) const { return (id < locations_count()); }